

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

void __thiscall
CNsc5BlockHelper::CNsc5BlockHelper
          (CNsc5BlockHelper *this,CNscPStackEntry *pNew,NscPCode5Block *pPrev,int nPrevIndex)

{
  size_t sVar1;
  CNscContext *pCVar2;
  int iVar3;
  uchar *puVar4;
  
  if (pNew == (CNscPStackEntry *)0x0) {
    if (pPrev == (NscPCode5Block *)0x0) {
      this->m_pauchData = (uchar *)0x0;
      this->m_ulSize = 0;
      this->m_nFile = -1;
      iVar3 = -1;
    }
    else {
      sVar1 = pPrev->anSize[nPrevIndex];
      if (sVar1 == 0) {
        puVar4 = (uchar *)0x0;
      }
      else {
        puVar4 = (uchar *)((long)pPrev->anSize + (pPrev->anOffset[nPrevIndex] - 0x10));
      }
      this->m_pauchData = puVar4;
      this->m_ulSize = sVar1;
      this->m_nFile = pPrev->anFile[nPrevIndex];
      iVar3 = pPrev->anLine[nPrevIndex];
    }
  }
  else {
    this->m_pauchData = pNew->m_pauchData;
    this->m_ulSize = pNew->m_nDataSize;
    pCVar2 = g_pCtx;
    this->m_nFile = g_pCtx->m_anFileNumbers[0];
    iVar3 = pCVar2->m_anLineNumbers[0];
  }
  this->m_nLine = iVar3;
  return;
}

Assistant:

CNsc5BlockHelper (CNscPStackEntry *pNew, 
		NscPCode5Block *pPrev, int nPrevIndex)
	{
		if (pNew)
		{
			m_pauchData = pNew ->GetData ();
			m_ulSize = pNew ->GetDataSize ();
			m_nFile = g_pCtx ->GetFile (0);
			m_nLine = g_pCtx ->GetLine (0);
		}
		else if (pPrev)
		{
			if (pPrev ->anSize [nPrevIndex] > 0)
			{
				m_pauchData = &((unsigned char *) pPrev) 
					[pPrev ->anOffset [nPrevIndex]];
			}
			else
			{
				m_pauchData = NULL;
			}
			m_ulSize = pPrev ->anSize [nPrevIndex];
			m_nFile = pPrev ->anFile [nPrevIndex];
			m_nLine = pPrev ->anLine [nPrevIndex];
		}
		else
		{
			m_pauchData = NULL;
			m_ulSize = 0;
			m_nFile = -1;
			m_nLine = -1;
		}
	}